

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptSamplerType(HlslGrammar *this,TType *type)

{
  EHlslTokenClass EVar1;
  uint uVar2;
  TSampler sampler;
  TSampler local_c4;
  TType local_c0;
  
  EVar1 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  uVar2 = EVar1 - EHTokSampler;
  if (uVar2 < 7) {
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    local_c4 = (TSampler)((uint)local_c4 & 0x80000000 | *(uint *)(&DAT_00711824 + (ulong)uVar2 * 4))
    ;
    TType::TType(&local_c0,&local_c4,EvqUniform,(TArraySizes *)0x0);
    TType::shallowCopy(type,&local_c0);
  }
  return uVar2 < 7;
}

Assistant:

bool HlslGrammar::acceptSamplerType(TType& type)
{
    // read sampler type
    const EHlslTokenClass samplerType = peek();

    // TODO: for DX9
    // TSamplerDim dim = EsdNone;

    bool isShadow = false;

    switch (samplerType) {
    case EHTokSampler:      break;
    case EHTokSampler1d:    /*dim = Esd1D*/; break;
    case EHTokSampler2d:    /*dim = Esd2D*/; break;
    case EHTokSampler3d:    /*dim = Esd3D*/; break;
    case EHTokSamplerCube:  /*dim = EsdCube*/; break;
    case EHTokSamplerState: break;
    case EHTokSamplerComparisonState: isShadow = true; break;
    default:
        return false;  // not a sampler declaration
    }

    advanceToken();  // consume the sampler type keyword

    TArraySizes* arraySizes = nullptr; // TODO: array

    TSampler sampler;
    sampler.setPureSampler(isShadow);

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));

    return true;
}